

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_base64Binary(void)

{
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  XSValue_Data *pXVar6;
  XSValue *pXVar7;
  char *pcVar8;
  wchar16 *pwVar9;
  long lVar10;
  int iVar11;
  void *pvVar12;
  int iVar13;
  Status myStatus;
  uint uStack_13c;
  StrX local_138;
  char lex_iv_1 [8];
  Status myStatus_8;
  char lex_iv_2 [12];
  char lex_v_2 [10];
  char lex_v_2_canrep [9];
  char lex_v_1 [21];
  char lex_v_1_canrep [13];
  undefined8 local_b0;
  undefined8 local_88;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(lex_v_1,"  134x cv56 gui0   \n",0x15);
  builtin_strncpy(lex_v_2,"wxtz 8e4k",10);
  builtin_strncpy(lex_iv_2,"134xcv56gui",0xc);
  builtin_strncpy(lex_iv_1,"wxtz8e4",8);
  puVar4 = (undefined8 *)operator_new__(9);
  *puVar4 = 0xe8827afe72317ed7;
  *(undefined1 *)(puVar4 + 1) = 0xb4;
  puVar5 = (undefined8 *)operator_new__(9);
  *puVar5 = 0x24eef1731bc3;
  *(undefined1 *)(puVar5 + 1) = 0;
  builtin_strncpy(lex_v_1_canrep + 8,"gui0",5);
  builtin_strncpy(lex_v_1_canrep,"134xcv56",8);
  builtin_strncpy(lex_v_2_canrep,"wxtz8e4k",9);
  _myStatus = (char *)((ulong)uStack_13c << 0x20);
  StrX::StrX(&local_138,lex_v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xda7,lex_v_1,local_138.fLocalForm,1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_138,lex_v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xda8,lex_v_2,local_138.fLocalForm,1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_138,lex_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      pcVar1 = local_138.fLocalForm;
      pcVar8 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xdab,lex_iv_1,pcVar1,"st_FOCA0002",pcVar8);
      goto LAB_0011c120;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xdab,lex_iv_1,local_138.fLocalForm,0);
LAB_0011c120:
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_138,lex_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_0011c207;
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    pcVar1 = local_138.fLocalForm;
    pcVar8 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xdac,lex_iv_2,pcVar1,"st_FOCA0002",pcVar8);
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xdac,lex_iv_2,local_138.fLocalForm,0);
  }
  StrX::~StrX(&local_138);
  errSeen = 1;
LAB_0011c207:
  iVar13 = 2;
  while (iVar11 = iVar13 + -1, iVar13 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_138,lex_v_1);
    pvVar12 = (void *)0xf;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,iVar13 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdc6,lex_v_1);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    else {
      expValue.fValue.f_strVal = (XMLCh *)puVar4;
      expValue._0_8_ = local_88;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar3 = compareActualValue(dt_base64Binary,*pXVar6,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_138,lex_v_2);
    pvVar12 = (void *)0xf;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,iVar13 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdc7,lex_v_2);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    else {
      expValue_00.fValue.f_strVal = (XMLCh *)puVar5;
      expValue_00._0_8_ = local_b0;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar3 = compareActualValue(dt_base64Binary,*pXVar6,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_138,lex_iv_1);
    pXVar7 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,iVar13 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    if (pXVar7 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar1 = local_138.fLocalForm;
        pcVar8 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xdca,lex_iv_1,pcVar1,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_138);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      pvVar12 = (void *)0xdca;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdca,lex_iv_1);
      StrX::~StrX(&local_138);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar7);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar7,pvVar12);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_138,lex_iv_2);
    pXVar7 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,iVar13 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_138);
    iVar13 = iVar11;
    if (pXVar7 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar1 = local_138.fLocalForm;
        pcVar8 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xdcb,lex_iv_2,pcVar1,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_138);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      pvVar12 = (void *)0xdcb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdcb,lex_iv_2);
      StrX::~StrX(&local_138);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar7);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar7,pvVar12);
    }
  }
  iVar13 = 2;
LAB_0011c65f:
  iVar11 = iVar13 + -1;
  if (iVar13 == 0) {
    return;
  }
  myStatus_8 = st_Init;
  StrX::StrX(&local_138,lex_v_1);
  pwVar9 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_138.fUnicodeForm,dt_base64Binary,&myStatus_8,ver_10,iVar13 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (pwVar9 == (wchar16 *)0x0) {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xde7,lex_v_1);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_1_canrep);
    if (!bVar3) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xde7,lex_v_1,local_138.fLocalForm,_myStatus,lex_v_1_canrep);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar9);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_8 = st_Init;
  StrX::StrX(&local_138,lex_v_2);
  pwVar9 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_138.fUnicodeForm,dt_base64Binary,&myStatus_8,ver_10,iVar13 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (pwVar9 == (wchar16 *)0x0) {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xde8,lex_v_2);
    StrX::~StrX(&local_138);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_2_canrep);
    if (!bVar3) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xde8,lex_v_2,local_138.fLocalForm,_myStatus,lex_v_2_canrep);
      StrX::~StrX(&local_138);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar9);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_138,lex_iv_1);
  lVar10 = xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,iVar13 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  if (lVar10 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      pcVar1 = local_138.fLocalForm;
      pcVar8 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xdeb,lex_iv_1,pcVar1,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_138);
      goto LAB_0011c980;
    }
  }
  else {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xdeb,lex_iv_1);
    StrX::~StrX(&local_138);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar10);
LAB_0011c980:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_138,lex_iv_2);
  lVar10 = xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_138.fUnicodeForm,dt_base64Binary,&myStatus,ver_10,iVar13 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  iVar13 = iVar11;
  if (lVar10 == 0) goto LAB_0011ca17;
  StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0xdec,lex_iv_2);
  StrX::~StrX(&local_138);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar10);
  goto LAB_0011ca6b;
LAB_0011ca17:
  if (myStatus != st_FOCA0002) {
    StrX::StrX(&local_138,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    pcVar1 = local_138.fLocalForm;
    pcVar8 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xdec,lex_iv_2,pcVar1,"st_FOCA0002",pcVar8);
    StrX::~StrX(&local_138);
LAB_0011ca6b:
    errSeen = 1;
  }
  goto LAB_0011c65f;
}

Assistant:

void test_dt_base64Binary()
{
    const XSValue::DataType dt = XSValue::dt_base64Binary;
    bool  toValidate = true;

    const char lex_v_1[]="  134x cv56 gui0   \n";
    const char lex_v_2[]="wxtz 8e4k";

    const char lex_iv_2[]="134xcv56gui";
    const char lex_iv_1[]="wxtz8e4";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    //actual values:
    //"134x cv56 gui0"  :     D7 7E 31 72 FE 7A 82 E8 B4
    //"wxtz 8e4k"       :     C3 1B 73 F1 EE 24
    act_v_ran_v_1.fValue.f_byteVal = new XMLByte[9];
    act_v_ran_v_1.fValue.f_byteVal[0] = 0xd7;
    act_v_ran_v_1.fValue.f_byteVal[1] = 0x7e;
    act_v_ran_v_1.fValue.f_byteVal[2] = 0x31;
    act_v_ran_v_1.fValue.f_byteVal[3] = 0x72;
    act_v_ran_v_1.fValue.f_byteVal[4] = 0xfe;
    act_v_ran_v_1.fValue.f_byteVal[5] = 0x7a;
    act_v_ran_v_1.fValue.f_byteVal[6] = 0x82;
    act_v_ran_v_1.fValue.f_byteVal[7] = 0xe8;
    act_v_ran_v_1.fValue.f_byteVal[8] = 0xb4;
    act_v_ran_v_2.fValue.f_byteVal = new XMLByte[9];
    act_v_ran_v_2.fValue.f_byteVal[0] = 0xc3;
    act_v_ran_v_2.fValue.f_byteVal[1] = 0x1b;
    act_v_ran_v_2.fValue.f_byteVal[2] = 0x73;
    act_v_ran_v_2.fValue.f_byteVal[3] = 0xf1;
    act_v_ran_v_2.fValue.f_byteVal[4] = 0xee;
    act_v_ran_v_2.fValue.f_byteVal[5] = 0x24;
    act_v_ran_v_2.fValue.f_byteVal[6] = 0;
    act_v_ran_v_2.fValue.f_byteVal[7] = 0;
    act_v_ran_v_2.fValue.f_byteVal[8] = 0;

    const char lex_v_1_canrep[]="134xcv56gui0";
    const char lex_v_2_canrep[]="wxtz8e4k";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid                                  true              n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(lex_v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid                                    XSValue         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid                                    XSValue         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid
        ACTVALUE_TEST(lex_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(lex_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *  lexical valid                                    XMLCh            n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid                                    XMLCh            n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid
        CANREP_TEST(lex_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, lex_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, lex_v_2_canrep, DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,   XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,   XSValue::st_FOCA0002);
    }

}